

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O3

bool bssl::ssl_client_hello_decrypt
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,bool *out_is_decrypt_error,
               Array<unsigned_char> *out,SSL_CLIENT_HELLO *client_hello_outer,
               Span<const_unsigned_char> payload)

{
  uint8_t *__src;
  size_t new_size;
  bool bVar1;
  int iVar2;
  ulong __n;
  ptrdiff_t _Num;
  ulong uVar3;
  Span<const_unsigned_char> encoded_client_hello_inner;
  Span<const_unsigned_char> in;
  size_t len;
  SSL_CLIENT_HELLO *client_hello_outer_00;
  Array<unsigned_char> local_78;
  SSL_HANDSHAKE *local_60;
  Array<unsigned_char> local_58;
  Array<unsigned_char> *local_40;
  uchar *local_38;
  
  *out_is_decrypt_error = false;
  local_58.data_ = (uchar *)0x0;
  local_58.size_ = 0;
  __src = client_hello_outer->client_hello;
  new_size = client_hello_outer->client_hello_len;
  local_60 = hs;
  local_40 = out;
  bVar1 = Array<unsigned_char>::InitUninitialized(&local_58,new_size);
  if (bVar1 && new_size != 0) {
    memmove(local_58.data_,__src,new_size);
  }
  if (!bVar1) {
    *out_alert = 'P';
    bVar1 = false;
    goto LAB_0013216e;
  }
  if (payload.data_ < client_hello_outer->extensions) {
    __assert_fail("reinterpret_cast<uintptr_t>(client_hello_outer->extensions) <= reinterpret_cast<uintptr_t>(payload.data())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x121,
                  "bool bssl::ssl_client_hello_decrypt(SSL_HANDSHAKE *, uint8_t *, bool *, Array<uint8_t> *, const SSL_CLIENT_HELLO *, Span<const uint8_t>)"
                 );
  }
  if (client_hello_outer->extensions + client_hello_outer->extensions_len <
      payload.data_ + payload.size_) {
    __assert_fail("reinterpret_cast<uintptr_t>(client_hello_outer->extensions + client_hello_outer->extensions_len) >= reinterpret_cast<uintptr_t>(payload.data() + payload.size())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x124,
                  "bool bssl::ssl_client_hello_decrypt(SSL_HANDSHAKE *, uint8_t *, bool *, Array<uint8_t> *, const SSL_CLIENT_HELLO *, Span<const uint8_t>)"
                 );
  }
  uVar3 = (long)payload.data_ - (long)client_hello_outer->client_hello;
  if (local_58.size_ < uVar3) {
LAB_00132189:
    abort();
  }
  __n = local_58.size_ - uVar3;
  if (payload.size_ <= local_58.size_ - uVar3) {
    __n = payload.size_;
  }
  if (__n != 0) {
    memset((void *)(uVar3 + (long)local_58.data_),0,__n);
  }
  local_78.data_ = (uchar *)0x0;
  local_78.size_ = 0;
  bVar1 = Array<unsigned_char>::InitUninitialized(&local_78,payload.size_);
  if (bVar1) {
    client_hello_outer_00 = (SSL_CLIENT_HELLO *)local_58.data_;
    iVar2 = EVP_HPKE_CTX_open(&(local_60->ech_hpke_ctx).ctx_,local_78.data_,(size_t *)&local_38,
                              local_78.size_,payload.data_,payload.size_,local_58.data_,
                              local_58.size_);
    if (iVar2 == 0) {
      *out_alert = '3';
      *out_is_decrypt_error = true;
      ERR_put_error(0x10,0,0x8a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x145);
      goto LAB_00132162;
    }
    if (local_78.size_ < local_38) goto LAB_00132189;
    local_78.size_ = (size_t)local_38;
    encoded_client_hello_inner.size_ = (size_t)client_hello_outer;
    encoded_client_hello_inner.data_ = local_38;
    bVar1 = ssl_decode_client_hello_inner
                      ((bssl *)local_60->ssl,(SSL *)out_alert,(uint8_t *)local_40,
                       (Array<unsigned_char> *)local_78.data_,encoded_client_hello_inner,
                       client_hello_outer_00);
    if (!bVar1) goto LAB_00132162;
    bVar1 = true;
    in.size_ = (size_t)client_hello_outer;
    in.data_ = (uchar *)local_40->size_;
    ssl_do_msg_callback((bssl *)local_60->ssl,(SSL *)0x0,0x101,(int)local_40->data_,in);
  }
  else {
    *out_alert = 'P';
LAB_00132162:
    bVar1 = false;
  }
  OPENSSL_free(local_78.data_);
LAB_0013216e:
  OPENSSL_free(local_58.data_);
  return bVar1;
}

Assistant:

bool ssl_client_hello_decrypt(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                              bool *out_is_decrypt_error, Array<uint8_t> *out,
                              const SSL_CLIENT_HELLO *client_hello_outer,
                              Span<const uint8_t> payload) {
  *out_is_decrypt_error = false;

  // The ClientHelloOuterAAD is |client_hello_outer| with |payload| (which must
  // point within |client_hello_outer->extensions|) replaced with zeros. See
  // draft-ietf-tls-esni-13, section 5.2.
  Array<uint8_t> aad;
  if (!aad.CopyFrom(Span(client_hello_outer->client_hello,
                         client_hello_outer->client_hello_len))) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  // We assert with |uintptr_t| because the comparison would be UB if they
  // didn't alias.
  assert(reinterpret_cast<uintptr_t>(client_hello_outer->extensions) <=
         reinterpret_cast<uintptr_t>(payload.data()));
  assert(reinterpret_cast<uintptr_t>(client_hello_outer->extensions +
                                     client_hello_outer->extensions_len) >=
         reinterpret_cast<uintptr_t>(payload.data() + payload.size()));
  Span<uint8_t> payload_aad = Span(aad).subspan(
      payload.data() - client_hello_outer->client_hello, payload.size());
  OPENSSL_memset(payload_aad.data(), 0, payload_aad.size());

  // Decrypt the EncodedClientHelloInner.
  Array<uint8_t> encoded;
  if (CRYPTO_fuzzer_mode_enabled()) {
    // In fuzzer mode, disable encryption to improve coverage. We reserve a
    // short input to signal decryption failure, so the fuzzer can explore
    // fallback to ClientHelloOuter.
    const uint8_t kBadPayload[] = {0xff};
    if (payload == kBadPayload) {
      *out_alert = SSL_AD_DECRYPT_ERROR;
      *out_is_decrypt_error = true;
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED);
      return false;
    }
    if (!encoded.CopyFrom(payload)) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  } else {
    if (!encoded.InitForOverwrite(payload.size())) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
    size_t len;
    if (!EVP_HPKE_CTX_open(hs->ech_hpke_ctx.get(), encoded.data(), &len,
                           encoded.size(), payload.data(), payload.size(),
                           aad.data(), aad.size())) {
      *out_alert = SSL_AD_DECRYPT_ERROR;
      *out_is_decrypt_error = true;
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED);
      return false;
    }
    encoded.Shrink(len);
  }

  if (!ssl_decode_client_hello_inner(hs->ssl, out_alert, out, encoded,
                                     client_hello_outer)) {
    return false;
  }

  ssl_do_msg_callback(hs->ssl, /*is_write=*/0, SSL3_RT_CLIENT_HELLO_INNER,
                      *out);
  return true;
}